

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O3

FT_Pointer ft_mem_strdup(FT_Memory memory,char *str,FT_Error *p_error)

{
  size_t __n;
  FT_Error FVar1;
  size_t sVar2;
  void *__dest;
  
  FVar1 = 0;
  if (str == (char *)0x0) {
LAB_00138f44:
    __dest = (FT_Pointer)0x0;
  }
  else {
    sVar2 = strlen(str);
    __n = sVar2 + 1;
    if (sVar2 < 0x7fffffffffffffff) {
      __dest = (*memory->alloc)(memory,__n);
      if (__dest == (void *)0x0) {
        FVar1 = 0x40;
        goto LAB_00138f44;
      }
    }
    else {
      FVar1 = 6;
      __dest = (FT_Pointer)0x0;
      if (__n != 0) goto LAB_00138f66;
    }
    memcpy(__dest,str,__n);
    FVar1 = 0;
  }
LAB_00138f66:
  *p_error = FVar1;
  return __dest;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_strdup( FT_Memory    memory,
                 const char*  str,
                 FT_Error    *p_error )
  {
    FT_ULong  len = str ? (FT_ULong)ft_strlen( str ) + 1
                        : 0;


    return ft_mem_dup( memory, str, len, p_error );
  }